

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O2

errr finish_parse_projection(parser *p)

{
  ushort uVar1;
  angband_constants *paVar2;
  int iVar3;
  void *pvVar4;
  undefined8 *p_00;
  long lVar5;
  int iVar6;
  undefined8 *puVar7;
  char *fmt;
  undefined8 *puVar8;
  long lVar9;
  byte bVar10;
  
  bVar10 = 0;
  z_info->projection_max = 0;
  pvVar4 = parser_priv(p);
  paVar2 = z_info;
  iVar6 = 0;
  for (; pvVar4 != (void *)0x0; pvVar4 = *(void **)((long)pvVar4 + 0x60)) {
    paVar2->projection_max = paVar2->projection_max + 1;
    if (*(char **)((long)pvVar4 + 0x10) != (char *)0x0) {
      iVar3 = strcmp(*(char **)((long)pvVar4 + 0x10),"element");
      iVar6 = iVar6 + (uint)(iVar3 == 0);
    }
  }
  if (iVar6 < 0x19) {
    fmt = "Too few elements in projection.txt!";
  }
  else {
    if (iVar6 == 0x19) goto LAB_0017e042;
    fmt = "Too many elements in projection.txt!";
  }
  quit_fmt(fmt);
LAB_0017e042:
  projections = (projection_conflict *)mem_zalloc((ulong)z_info->projection_max * 0x68);
  uVar1 = z_info->projection_max;
  p_00 = (undefined8 *)parser_priv(p);
  lVar9 = (ulong)uVar1 * 0x68;
  while (p_00 != (undefined8 *)0x0) {
    puVar7 = p_00;
    puVar8 = (undefined8 *)((long)&projections[-1].index + lVar9);
    for (lVar5 = 0xd; lVar5 != 0; lVar5 = lVar5 + -1) {
      *puVar8 = *puVar7;
      puVar7 = puVar7 + (ulong)bVar10 * -2 + 1;
      puVar8 = puVar8 + (ulong)bVar10 * -2 + 1;
    }
    puVar7 = (undefined8 *)p_00[0xc];
    mem_free(p_00);
    p_00 = puVar7;
    lVar9 = lVar9 + -0x68;
  }
  parser_destroy(p);
  return 0;
}

Assistant:

static errr finish_parse_projection(struct parser *p) {
	struct projection *projection, *next = NULL;
	int element_count = 0, count = 0;

	/* Count the entries */
	z_info->projection_max = 0;
	projection = parser_priv(p);
	while (projection) {
		z_info->projection_max++;
		if (projection->type && streq(projection->type, "element")) {
			element_count++;
		}
		projection = projection->next;
	}

	if (element_count + 1 < (int) N_ELEMENTS(element_names)) {
		quit_fmt("Too few elements in projection.txt!");
	} else if (element_count + 1 > (int) N_ELEMENTS(element_names)) {
		quit_fmt("Too many elements in projection.txt!");
	}

	/* Allocate the direct access list and copy the data to it */
	projections = mem_zalloc((z_info->projection_max) * sizeof(*projection));
	count = z_info->projection_max - 1;
	for (projection = parser_priv(p); projection; projection = next, count--) {
		memcpy(&projections[count], projection, sizeof(*projection));
		next = projection->next;
		mem_free(projection);
	}

	parser_destroy(p);
	return 0;
}